

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::writeEncryptionDictionary(QPDFWriter *this)

{
  element_type *peVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  element_type *__n;
  
  iVar2 = openObject(this,((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->encryption_dict_objid);
  __n = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __n->encryption_dict_objid = iVar2;
  ::qpdf::pl::Count::write(__n->pipeline,0x27d8cc,(void *)0x2,(size_t)__n);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (p_Var3 = *(_Base_ptr *)
                 ((long)&(peVar1->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var3 != &(peVar1->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27db2e,(void *)0x1,(size_t)__n);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)*(undefined8 *)(p_Var3 + 1),p_Var3[1]._M_parent,(size_t)__n);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27db2e,(void *)0x1,(size_t)__n);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent,(size_t)__n);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dd2e,(void *)0x3,(size_t)__n);
  closeObject(this,((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->encryption_dict_objid);
  return;
}

Assistant:

void
QPDFWriter::writeEncryptionDictionary()
{
    m->encryption_dict_objid = openObject(m->encryption_dict_objid);
    writeString("<<");
    for (auto const& iter: m->encryption_dictionary) {
        writeString(" ");
        writeString(iter.first);
        writeString(" ");
        writeString(iter.second);
    }
    writeString(" >>");
    closeObject(m->encryption_dict_objid);
}